

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

value * __thiscall picojson::value::operator=(value *this,value *x)

{
  _storage _Var1;
  int iVar2;
  value t;
  value local_20;
  
  if (this != x) {
    value(&local_20,x);
    iVar2 = this->type_;
    this->type_ = local_20.type_;
    _Var1 = this->u_;
    this->u_ = local_20.u_;
    local_20.type_ = iVar2;
    local_20.u_ = _Var1;
    clear(&local_20);
  }
  return this;
}

Assistant:

inline value &value::operator=(const value &x) {
  if (this != &x) {
    value t(x);
    swap(t);
  }
  return *this;
}